

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcm.cpp
# Opt level: O0

int mbedtls_gcm_update_ad(mbedtls_gcm_context *ctx,uchar *add,size_t add_len)

{
  mbedtls_gcm_context *ctx_00;
  ulong uVar1;
  ulong in_RDX;
  long lVar2;
  long in_RSI;
  long lVar3;
  long in_RDI;
  uint64_t new_add_len;
  size_t offset;
  size_t use_len;
  uchar *p;
  uint64_t x_2;
  size_t i_2;
  uint64_t x_1;
  size_t i_1;
  uint64_t x;
  size_t i;
  uint64_t r_1;
  uint64_t r;
  uint64_t r_3;
  uint64_t r_2;
  uint64_t r_5;
  uint64_t r_4;
  uchar *in_stack_fffffffffffffe98;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 local_140;
  undefined4 local_124;
  undefined8 local_118;
  undefined8 local_d8;
  undefined8 local_98;
  
  ctx_00 = (mbedtls_gcm_context *)(*(long *)(in_RDI + 0x150) + in_RDX);
  if ((ctx_00 < *(mbedtls_gcm_context **)(in_RDI + 0x150)) || ((ulong)ctx_00 >> 0x3d != 0)) {
    local_124 = -0x14;
  }
  else {
    uVar1 = *(ulong *)(in_RDI + 0x150) & 0xf;
    local_148 = in_RSI;
    local_140 = in_RDX;
    if (uVar1 != 0) {
      local_150 = 0x10 - uVar1;
      if (in_RDX < local_150) {
        local_150 = in_RDX;
      }
      lVar3 = in_RDI + 0x178 + uVar1;
      lVar2 = in_RDI + 0x178 + uVar1;
      for (local_98 = 0; local_98 + 8 <= local_150; local_98 = local_98 + 8) {
        *(ulong *)(lVar3 + local_98) = *(ulong *)(lVar2 + local_98) ^ *(ulong *)(in_RSI + local_98);
      }
      for (; local_98 < local_150; local_98 = local_98 + 1) {
        *(byte *)(lVar3 + local_98) = *(byte *)(lVar2 + local_98) ^ *(byte *)(in_RSI + local_98);
      }
      if (uVar1 + local_150 == 0x10) {
        gcm_mult(ctx_00,in_stack_fffffffffffffe98,(uchar *)0x87c01a);
      }
      *(ulong *)(in_RDI + 0x150) = local_150 + *(long *)(in_RDI + 0x150);
      local_140 = in_RDX - local_150;
      local_148 = local_150 + in_RSI;
    }
    *(ulong *)(in_RDI + 0x150) = local_140 + *(long *)(in_RDI + 0x150);
    for (; 0xf < local_140; local_140 = local_140 - 0x10) {
      for (local_d8 = 0; local_d8 + 8 < 0x11; local_d8 = local_d8 + 8) {
        *(ulong *)(in_RDI + 0x178 + local_d8) =
             *(ulong *)(in_RDI + 0x178 + local_d8) ^ *(ulong *)(local_148 + local_d8);
      }
      for (; local_d8 < 0x10; local_d8 = local_d8 + 1) {
        *(byte *)(in_RDI + 0x178 + local_d8) =
             *(byte *)(in_RDI + 0x178 + local_d8) ^ *(byte *)(local_148 + local_d8);
      }
      gcm_mult(ctx_00,in_stack_fffffffffffffe98,(uchar *)0x87c22b);
      local_148 = local_148 + 0x10;
    }
    if (local_140 != 0) {
      for (local_118 = 0; local_118 + 8 <= local_140; local_118 = local_118 + 8) {
        *(ulong *)(in_RDI + 0x178 + local_118) =
             *(ulong *)(in_RDI + 0x178 + local_118) ^ *(ulong *)(local_148 + local_118);
      }
      for (; local_118 < local_140; local_118 = local_118 + 1) {
        *(byte *)(in_RDI + 0x178 + local_118) =
             *(byte *)(in_RDI + 0x178 + local_118) ^ *(byte *)(local_148 + local_118);
      }
    }
    local_124 = 0;
  }
  return local_124;
}

Assistant:

int mbedtls_gcm_update_ad(mbedtls_gcm_context *ctx,
                          const unsigned char *add, size_t add_len)
{
    const unsigned char *p;
    size_t use_len, offset;
    uint64_t new_add_len;

    /* AD is limited to 2^64 bits, ie 2^61 bytes
     * Also check for possible overflow */
#if SIZE_MAX > 0xFFFFFFFFFFFFFFFFULL
    if (add_len > 0xFFFFFFFFFFFFFFFFULL) {
        return MBEDTLS_ERR_GCM_BAD_INPUT;
    }
#endif
    new_add_len = ctx->add_len + (uint64_t) add_len;
    if (new_add_len < ctx->add_len || new_add_len >> 61 != 0) {
        return MBEDTLS_ERR_GCM_BAD_INPUT;
    }

    offset = ctx->add_len % 16;
    p = add;

    if (offset != 0) {
        use_len = 16 - offset;
        if (use_len > add_len) {
            use_len = add_len;
        }

        mbedtls_xor(ctx->buf + offset, ctx->buf + offset, p, use_len);

        if (offset + use_len == 16) {
            gcm_mult(ctx, ctx->buf, ctx->buf);
        }

        ctx->add_len += use_len;
        add_len -= use_len;
        p += use_len;
    }

    ctx->add_len += add_len;

    while (add_len >= 16) {
        mbedtls_xor(ctx->buf, ctx->buf, p, 16);

        gcm_mult(ctx, ctx->buf, ctx->buf);

        add_len -= 16;
        p += 16;
    }

    if (add_len > 0) {
        mbedtls_xor(ctx->buf, ctx->buf, p, add_len);
    }

    return 0;
}